

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_gpio_mode_replace(mraa_gpio_context dev,mraa_gpio_mode_t mode)

{
  int iVar1;
  mraa_result_t mVar2;
  mraa_gpio_context dev_00;
  int local_2c;
  int value;
  mraa_gpio_context pullup_e;
  mraa_gpio_mode_t mode_local;
  mraa_gpio_context dev_local;
  
  if (dev->value_fp != -1) {
    iVar1 = close(dev->value_fp);
    if (iVar1 != 0) {
      return MRAA_ERROR_INVALID_RESOURCE;
    }
    dev->value_fp = -1;
  }
  dev_00 = mraa_gpio_init_raw(pullup_map[dev->phy_pin]);
  if (dev_00 == (mraa_gpio_context)0x0) {
    dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    mVar2 = mraa_gpio_dir(dev_00,MRAA_GPIO_IN);
    if (mVar2 == MRAA_SUCCESS) {
      local_2c = -1;
      switch(mode) {
      case MRAA_GPIO_STRONG:
        break;
      case MRAA_GPIO_PULLUP:
        local_2c = 1;
        break;
      case MRAA_GPIO_PULLDOWN:
        local_2c = 0;
        break;
      case MRAA_GPIO_HIZ:
        break;
      default:
        return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
      }
      if (local_2c != -1) {
        mVar2 = mraa_gpio_dir(dev_00,MRAA_GPIO_OUT);
        if (mVar2 != MRAA_SUCCESS) {
          syslog(3,"edison: Error setting pullup");
          mraa_gpio_close(dev_00);
          return MRAA_ERROR_INVALID_RESOURCE;
        }
        mVar2 = mraa_gpio_write(dev_00,local_2c);
        if (mVar2 != MRAA_SUCCESS) {
          syslog(3,"edison: Error setting pullup");
          mraa_gpio_close(dev_00);
          return MRAA_ERROR_INVALID_RESOURCE;
        }
      }
      dev_local._4_4_ = mraa_gpio_close(dev_00);
    }
    else {
      syslog(3,"edison: Failed to set gpio mode-pullup");
      mraa_gpio_close(dev_00);
      dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
  }
  return dev_local._4_4_;
}

Assistant:

mraa_result_t
mraa_intel_edison_gpio_mode_replace(mraa_gpio_context dev, mraa_gpio_mode_t mode)
{
    if (dev->value_fp != -1) {
        if (close(dev->value_fp) != 0) {
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        dev->value_fp = -1;
    }

    mraa_gpio_context pullup_e;
    pullup_e = mraa_gpio_init_raw(pullup_map[dev->phy_pin]);
    if (pullup_e == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(pullup_e, MRAA_GPIO_IN) != MRAA_SUCCESS) {
        syslog(LOG_ERR, "edison: Failed to set gpio mode-pullup");
        mraa_gpio_close(pullup_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    int value = -1;
    switch (mode) {
        case MRAA_GPIO_STRONG:
            break;
        case MRAA_GPIO_PULLUP:
            value = 1;
            break;
        case MRAA_GPIO_PULLDOWN:
            value = 0;
            break;
        case MRAA_GPIO_HIZ:
            break;
        default:
            return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }
    if (value != -1) {
        if (mraa_gpio_dir(pullup_e, MRAA_GPIO_OUT) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "edison: Error setting pullup");
            mraa_gpio_close(pullup_e);
            return MRAA_ERROR_INVALID_RESOURCE;
        }
        if (mraa_gpio_write(pullup_e, value) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "edison: Error setting pullup");
            mraa_gpio_close(pullup_e);
            return MRAA_ERROR_INVALID_RESOURCE;
        }
    }

    return mraa_gpio_close(pullup_e);
}